

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::CaseAssertionExpr::fromSyntax(CasePropertyExprSyntax *syntax,ASTContext *context)

{
  size_t sVar1;
  PropertyCaseItemSyntax *pPVar2;
  int iVar3;
  AssertionExpr *pAVar4;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CaseAssertionExpr *pCVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *pEVar7;
  pointer ppPVar8;
  long lVar9;
  Compilation *this;
  ulong uVar10;
  AssertionExpr *defCase;
  SmallVector<const_slang::ast::Expression_*,_5UL> exprs;
  SmallVector<slang::ast::CaseAssertionExpr::ItemGroup,_4UL> items;
  AssertionExpr *local_130;
  Expression *local_128;
  Compilation *local_120;
  AssertionExpr *local_118;
  AssertionExpr *local_110;
  pointer local_108;
  ItemGroup local_100;
  undefined1 local_e8 [64];
  SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> local_a8 [2];
  
  this = ((context->scope).ptr)->compilation;
  local_128 = bindExpr((syntax->expr).ptr,context,false,false);
  local_130 = (AssertionExpr *)0x0;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  sVar1 = (syntax->items).
          super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  pEVar7 = extraout_RDX;
  if (sVar1 != 0) {
    ppPVar8 = (syntax->items).
              super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>._M_ptr;
    local_108 = ppPVar8 + sVar1;
    pAVar4 = (AssertionExpr *)0x0;
    local_120 = this;
    do {
      pPVar2 = *ppPVar8;
      if ((pPVar2->super_SyntaxNode).kind == StandardPropertyCaseItem) {
        local_118 = pAVar4;
        iVar3 = AssertionExpr::bind(*(AssertionExpr **)&pPVar2[4].super_SyntaxNode,(int)context,
                                    (sockaddr *)0x0,0);
        local_110 = (AssertionExpr *)CONCAT44(extraout_var,iVar3);
        local_e8._8_8_ = 0;
        local_e8._16_8_ = 5;
        uVar10 = *(long *)&pPVar2[3].super_SyntaxNode + 1;
        pEVar7 = extraout_RDX_00;
        local_e8._0_8_ = (pointer)(local_e8 + 0x18);
        if (1 < uVar10) {
          uVar10 = uVar10 >> 1;
          lVar9 = 0;
          do {
            ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                  *)((long)&(pPVar2[2].super_SyntaxNode.previewNode)->kind + lVar9))
            ;
            local_100.expressions._M_ptr =
                 (pointer)bindExpr((ExpressionSyntax *)*ppSVar5,context,false,false);
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_e8,
                       (Expression **)&local_100);
            lVar9 = lVar9 + 0x30;
            uVar10 = uVar10 - 1;
            pEVar7 = extraout_RDX_01;
          } while (uVar10 != 0);
        }
        this = local_120;
        iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          ((SmallVectorBase<const_slang::ast::Expression_*> *)local_e8,
                           (EVP_PKEY_CTX *)local_120,pEVar7);
        local_100.expressions._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar3);
        local_100.body.ptr = local_110;
        SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
        emplace_back<slang::ast::CaseAssertionExpr::ItemGroup>(local_a8,&local_100);
        pAVar4 = local_118;
        pEVar7 = extraout_RDX_02;
        if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x18)) {
          operator_delete((void *)local_e8._0_8_);
          pAVar4 = local_118;
          pEVar7 = extraout_RDX_03;
        }
      }
      else if (pAVar4 == (AssertionExpr *)0x0) {
        iVar3 = AssertionExpr::bind((AssertionExpr *)pPVar2[2].super_SyntaxNode.parent,(int)context,
                                    (sockaddr *)0x0,0);
        local_130 = (AssertionExpr *)CONCAT44(extraout_var_01,iVar3);
        pAVar4 = local_130;
        pEVar7 = extraout_RDX_04;
      }
      ppPVar8 = ppPVar8 + 1;
    } while (ppPVar8 != local_108);
  }
  iVar3 = SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::copy
                    (local_a8,(EVP_PKEY_CTX *)this,pEVar7);
  local_e8._0_8_ = CONCAT44(extraout_var_02,iVar3);
  pCVar6 = BumpAllocator::
           emplace<slang::ast::CaseAssertionExpr,slang::ast::Expression_const&,std::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>,slang::ast::AssertionExpr_const*&>
                     (&this->super_BumpAllocator,local_128,
                      (span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
                      local_e8,&local_130);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return &pCVar6->super_AssertionExpr;
}

Assistant:

AssertionExpr& CaseAssertionExpr::fromSyntax(const CasePropertyExprSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bindExpr(*syntax.expr, context, /* allowInstances */ false, /* isBoolean */ false);

    const AssertionExpr* defCase = nullptr;
    SmallVector<ItemGroup, 4> items;
    for (auto item : syntax.items) {
        if (item->kind == SyntaxKind::StandardPropertyCaseItem) {
            auto& sci = item->as<StandardPropertyCaseItemSyntax>();
            auto& body = AssertionExpr::bind(*sci.expr, context);

            SmallVector<const Expression*> exprs;
            for (auto es : sci.expressions) {
                exprs.push_back(
                    &bindExpr(*es, context, /* allowInstances */ false, /* isBoolean */ false));
            }

            items.push_back(ItemGroup{exprs.copy(comp), &body});
        }
        else {
            // The parser already errored for duplicate defaults,
            // so just ignore if it happens here.
            if (!defCase) {
                defCase = &AssertionExpr::bind(*item->as<DefaultPropertyCaseItemSyntax>().expr,
                                               context);
            }
        }
    }

    return *comp.emplace<CaseAssertionExpr>(expr, items.copy(comp), defCase);
}